

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.h
# Opt level: O1

void __thiscall
JsUtil::GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator>::EnsureArray
          (GrowingArray<Wasm::WasmTypes::WasmType,_Memory::ArenaAllocator> *this)

{
  uint uVar1;
  uint uVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  WasmType *dst;
  Type pWVar8;
  
  if (this->buffer == (Type)0x0) {
    uVar1 = this->length;
    if ((ulong)uVar1 == 0) {
      pWVar8 = (Type)&DAT_00000008;
    }
    else {
      pAVar3 = &this->alloc->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar5) goto LAB_00f39ffc;
        *puVar7 = 0;
      }
      pWVar8 = (Type)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal(pAVar3,(ulong)uVar1 << 2);
      if (pWVar8 == (Type)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar5) {
LAB_00f39ffc:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
    }
    this->buffer = pWVar8;
    this->count = 0;
  }
  else {
    uVar1 = this->length;
    if (this->count == uVar1) {
      if (0x7ffffffe < uVar1) {
LAB_00f39ff7:
        Math::DefaultOverflowPolicy();
      }
      uVar1 = uVar1 * 2 + 2;
      if (uVar1 == 0) {
        dst = (WasmType *)&DAT_00000008;
      }
      else {
        pAVar3 = &this->alloc->
                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        BVar6 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar5) goto LAB_00f39ffc;
          *puVar7 = 0;
        }
        dst = (WasmType *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal(pAVar3,(ulong)uVar1 * 4);
        if (dst == (WasmType *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar5) goto LAB_00f39ffc;
          *puVar7 = 0;
        }
      }
      Memory::CopyArray<Wasm::WasmTypes::WasmType,Wasm::WasmTypes::WasmType,Memory::ArenaAllocator>
                (dst,(ulong)uVar1,this->buffer,(ulong)this->length);
      uVar2 = this->length;
      if ((ulong)uVar2 != 0) {
        if (0x3fffffff < uVar2) goto LAB_00f39ff7;
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (&this->alloc->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                   this->buffer,(ulong)uVar2 << 2);
      }
      this->length = uVar1;
      this->buffer = dst;
    }
  }
  return;
}

Assistant:

void EnsureArray()
        {
            if (buffer == nullptr)
            {
                buffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, length),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    length);
                count = 0;
            }
            else if (count == length)
            {
                uint32 newLength = UInt32Math::AddMul<1, 2>(length);
                TValue * newbuffer = AllocateArray<AllocatorType, TValue, false>(
                    TRACK_ALLOC_INFO(alloc, TValue, AllocatorType, 0, newLength),
                    TypeAllocatorFunc<TAllocator, TValue>::GetAllocFunc(),
                    newLength);
                CopyArray<TValue, TValue, TAllocator>(newbuffer, newLength, buffer, length);
#ifdef DIAG_MEM
                listFreeAmount += length;
#endif
                if (length != 0)
                {
                    const size_t lengthByteSize = UInt32Math::Mul(length, sizeof(TValue));
                    AllocatorFree(alloc, (TypeAllocatorFunc<TAllocator, int>::GetFreeFunc()), buffer, lengthByteSize);
                }
                length = newLength;
                buffer = newbuffer;
            }
        }